

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic.cpp
# Opt level: O1

void __thiscall SemanticTypes::visit(SemanticTypes *this,BooleanOPNode *booleanOpNode)

{
  int iVar1;
  uint uVar2;
  ExpNode *pEVar3;
  TokenNode *pTVar4;
  bool bVar5;
  
  (booleanOpNode->super_ExpNode).type = 8;
  (booleanOpNode->super_ExpNode).arraySize = -1;
  (booleanOpNode->super_ExpNode).lValue = false;
  (booleanOpNode->super_ExpNode).pointer = false;
  pEVar3 = booleanOpNode->exp1;
  if (pEVar3 != (ExpNode *)0x0) {
    (*(pEVar3->super_StmtNode).super_ASTNode._vptr_ASTNode[3])(pEVar3,this);
    pEVar3 = booleanOpNode->exp2;
    if (pEVar3 != (ExpNode *)0x0) {
      (*(pEVar3->super_StmtNode).super_ASTNode._vptr_ASTNode[3])(pEVar3,this);
      pTVar4 = booleanOpNode->op;
      if (pTVar4 != (TokenNode *)0x0) {
        (*(pTVar4->super_ExpNode).super_StmtNode.super_ASTNode._vptr_ASTNode[3])(pTVar4,this);
        pEVar3 = booleanOpNode->exp1;
        bVar5 = _match_exp_types(pEVar3,booleanOpNode->exp2);
        if (bVar5) {
          iVar1 = pEVar3->arraySize;
          uVar2 = booleanOpNode->op->token;
          if (((uVar2 - 3 < 2) || (booleanOpNode->op == (TokenNode *)0x0)) ||
             ((uVar2 & 0xfffffffb) - 1 < 2)) {
            if (pEVar3->type == 0xb) {
              if (-1 < iVar1) goto LAB_0011100c;
            }
            else if ((-1 < iVar1) || (pEVar3->type != 0xc)) goto LAB_0011100c;
            if (pEVar3->pointer != true) {
              return;
            }
          }
          else if (((iVar1 < 0) && (pEVar3->type == 8)) && (pEVar3->pointer == false)) {
            return;
          }
        }
      }
    }
  }
LAB_0011100c:
  visit();
  return;
}

Assistant:

void SemanticTypes::visit(BooleanOPNode *booleanOpNode) {

    booleanOpNode->setType(BOOL);
    booleanOpNode->setLValue(false);
    booleanOpNode->setPointer(false);
    booleanOpNode->setArraySize(-1);

    if (booleanOpNode->getExp1()) {
        booleanOpNode->getExp1()->accept(this);
    } else {
        fprintf(stderr, "[SEMANTIC ERROR - booleanOpNode] INVALID EXPRESSION 1, line %d\n", booleanOpNode->getLine());
        return;
    }

    if (booleanOpNode->getExp2()) {
        booleanOpNode->getExp2()->accept(this);
    } else {
        fprintf(stderr, "[SEMANTIC ERROR - booleanOpNode] INVALID EXPRESSION 2, line %d\n", booleanOpNode->getLine());
        return;
    }

    if (booleanOpNode->getOp()) {
        booleanOpNode->getOp()->accept(this);
    } else {
        fprintf(stderr, "[SEMANTIC ERROR - booleanOpNode] INVALID OPERATOR, line %d\n", booleanOpNode->getLine());
        return;
    }

    if (!_match_exp_types(booleanOpNode->getExp1(), booleanOpNode->getExp2())) {
        fprintf(stderr, "[SEMANTIC ERROR - booleanOpNode] CANNOT COMPARE DIFFERENT TYPES, line %d\n",
                booleanOpNode->getLine());
        return;
    }

    bool isArray = booleanOpNode->getExp1()->getArraySize() > -1;
    if (booleanOpNode->getOp()->getToken() != NE && booleanOpNode->getOp()->getToken() != EQ && booleanOpNode->getOp()
        && booleanOpNode->getOp()->getToken() != LT && booleanOpNode->getOp()->getToken() != LE && booleanOpNode->getOp()->getToken() != GE
            && booleanOpNode->getOp()->getToken() != GT)
    { //Pode sendo igual
    
        if(booleanOpNode->getExp1()->getType() != BOOL ||isArray || booleanOpNode->getExp1()->isPointer()) {
            fprintf(stderr, "[SEMANTIC ERROR - booleanOpNode] CANNOT COMPARE WITH NON BOOLEAN TYPES, line %d\n",
                    booleanOpNode->getLine());
            return;
        }
    } else {
        if ((booleanOpNode->getExp1()->getType() != INT && booleanOpNode->getExp1()->getType() != FLOAT) || isArray ||
            booleanOpNode->getExp1()->isPointer()) {
            fprintf(stderr, "[SEMANTIC ERROR - booleanOpNode] CANNOT COMPARE WITH NON NUMERIC TYPES, line %d\n",
                    booleanOpNode->getLine());
            return;
        }
    }
}